

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O0

void __thiscall VDasher::cubicTo(VDasher *this,VPointF *cp1,VPointF *cp2,VPointF *e)

{
  VPointF VVar1;
  VPointF *in_RCX;
  VDasher *in_RDI;
  float bezLen;
  VBezier b;
  VBezier right;
  VBezier left;
  VBezier *in_stack_ffffffffffffff18;
  VBezier *this_00;
  VDasher *in_stack_ffffffffffffff20;
  VBezier *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  float local_8c;
  VBezier local_88;
  float local_60;
  float fStack_5c;
  VBezier *in_stack_ffffffffffffffa8;
  undefined1 local_40 [64];
  
  local_40._32_8_ = in_RCX;
  VBezier::fromPoints((VPointF *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (VPointF *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (VPointF *)in_RDI,(VPointF *)in_stack_ffffffffffffff28);
  local_8c = VBezier::length(in_stack_ffffffffffffffa8);
  if (in_RDI->mCurrentLength < local_8c) {
    while (in_RDI->mCurrentLength <= local_8c && local_8c != in_RDI->mCurrentLength) {
      local_8c = local_8c - in_RDI->mCurrentLength;
      in_stack_ffffffffffffff28 = &local_88;
      in_stack_ffffffffffffff20 = (VDasher *)local_40;
      VBezier::splitAtLength
                ((VBezier *)in_RDI,(float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (VBezier *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      VBezier::pt2(in_stack_ffffffffffffff18);
      VBezier::pt3(in_stack_ffffffffffffff18);
      VBezier::pt4(in_stack_ffffffffffffff18);
      addCubic(in_RDI,(VPointF *)in_stack_ffffffffffffff28,(VPointF *)in_stack_ffffffffffffff20,
               (VPointF *)in_stack_ffffffffffffff18);
      updateActiveSegment(in_stack_ffffffffffffff20);
      local_88.x1 = local_60;
      local_88.y1 = fStack_5c;
      VVar1 = VBezier::pt1(in_stack_ffffffffffffff18);
      in_RDI->mCurPt = VVar1;
    }
    if (0.1 < local_8c) {
      in_RDI->mCurrentLength = in_RDI->mCurrentLength - local_8c;
      this_00 = &local_88;
      VBezier::pt2(this_00);
      VBezier::pt3(this_00);
      VBezier::pt4(this_00);
      addCubic(in_RDI,(VPointF *)in_stack_ffffffffffffff28,(VPointF *)in_stack_ffffffffffffff20,
               (VPointF *)this_00);
    }
  }
  else {
    in_RDI->mCurrentLength = in_RDI->mCurrentLength - local_8c;
    addCubic(in_RDI,(VPointF *)in_stack_ffffffffffffff28,(VPointF *)in_stack_ffffffffffffff20,
             (VPointF *)in_stack_ffffffffffffff18);
  }
  if (in_RDI->mCurrentLength <= 0.1 && in_RDI->mCurrentLength != 0.1) {
    updateActiveSegment(in_stack_ffffffffffffff20);
  }
  in_RDI->mCurPt = *(VPointF *)local_40._32_8_;
  return;
}

Assistant:

void VDasher::cubicTo(const VPointF &cp1, const VPointF &cp2, const VPointF &e)
{
    VBezier left, right;
    VBezier b = VBezier::fromPoints(mCurPt, cp1, cp2, e);
    float   bezLen = b.length();

    if (bezLen <= mCurrentLength) {
        mCurrentLength -= bezLen;
        addCubic(cp1, cp2, e);
    } else {
        while (bezLen > mCurrentLength) {
            bezLen -= mCurrentLength;
            b.splitAtLength(mCurrentLength, &left, &right);

            addCubic(left.pt2(), left.pt3(), left.pt4());
            updateActiveSegment();

            b = right;
            mCurPt = b.pt1();
        }
        // handle remainder
        if (bezLen > tolerance) {
            mCurrentLength -= bezLen;
            addCubic(b.pt2(), b.pt3(), b.pt4());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = e;
}